

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall zmq::array_t<zmq::pipe_t,_1>::push_back(array_t<zmq::pipe_t,_1> *this,pipe_t *item_)

{
  size_type sVar1;
  value_type *in_RSI;
  vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  array_item_t<1> *in_stack_ffffffffffffffe0;
  array_item_t<1> *this_00;
  
  if (in_RSI != (value_type *)0x0) {
    this_00 = (array_item_t<1> *)0x0;
    if (in_RSI != (value_type *)0x0) {
      this_00 = (array_item_t<1> *)(in_RSI + 3);
    }
    in_stack_ffffffffffffffe0 = this_00;
    sVar1 = std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::size(in_RDI);
    array_item_t<1>::set_array_index(this_00,(int)sVar1);
    in_stack_ffffffffffffffd8 = in_RSI;
  }
  std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::push_back
            ((vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void push_back (T *item_)
    {
        if (item_)
            static_cast<item_t *> (item_)->set_array_index (
              static_cast<int> (_items.size ()));
        _items.push_back (item_);
    }